

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int listen_socket(socket_server *ss,request_listen *request,socket_message *result)

{
  uint id_00;
  int fd;
  socket *psVar1;
  socket *s;
  int listen_fd;
  int id;
  socket_message *result_local;
  request_listen *request_local;
  socket_server *ss_local;
  
  id_00 = request->id;
  fd = request->fd;
  psVar1 = new_fd(ss,id_00,fd,0,request->opaque,false);
  if (psVar1 == (socket *)0x0) {
    close(fd);
    result->opaque = request->opaque;
    result->id = id_00;
    result->ud = 0;
    result->data = "reach skynet socket number limit";
    ss->slot[id_00 & 0xffff].type = 0;
    ss_local._4_4_ = 4;
  }
  else {
    psVar1->type = 2;
    ss_local._4_4_ = -1;
  }
  return ss_local._4_4_;
}

Assistant:

static int
listen_socket(struct socket_server *ss, struct request_listen * request, struct socket_message *result) {
	int id = request->id;
	int listen_fd = request->fd;
	struct socket *s = new_fd(ss, id, listen_fd, PROTOCOL_TCP, request->opaque, false);
	if (s == NULL) {
		goto _failed;
	}
	s->type = SOCKET_TYPE_PLISTEN;
	return -1;
_failed:
	close(listen_fd);
	result->opaque = request->opaque;
	result->id = id;
	result->ud = 0;
	result->data = "reach skynet socket number limit";
	ss->slot[HASH_ID(id)].type = SOCKET_TYPE_INVALID;

	return SOCKET_ERROR;
}